

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  char *__s;
  bool bVar7;
  
  pIVar3 = GImGui;
  if (text_end == (char *)0x0) {
    text_end = text;
    if (text != (char *)0xffffffffffffffff) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_0011c768;
        }
        else if (*text_end == '\0') goto LAB_0011c768;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
    }
    text_end = (char *)0xffffffffffffffff;
  }
LAB_0011c768:
  pIVar2 = GImGui->CurrentWindow;
  if (ref_pos == (ImVec2 *)0x0) {
    bVar7 = false;
  }
  else {
    bVar7 = (pIVar2->DC).LogLinePosY + 1.0 < ref_pos->y;
    (pIVar2->DC).LogLinePosY = ref_pos->y;
  }
  iVar6 = pIVar3->LogStartDepth;
  iVar1 = (pIVar2->DC).TreeDepth;
  if (iVar1 < iVar6) {
    pIVar3->LogStartDepth = iVar1;
    iVar6 = iVar1;
  }
  __s = text;
  do {
    pcVar4 = (char *)memchr(__s,10,(long)text_end - (long)__s);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = text_end;
    }
    if (__s != pcVar4 || pcVar4 != text_end) {
      uVar5 = (int)pcVar4 - (int)__s;
      if ((bool)(~bVar7 & __s == text)) {
        LogText(" %.*s",(ulong)uVar5,__s);
      }
      else {
        LogText("\n%*s%.*s",(ulong)(uint)((iVar1 - iVar6) * 4),"",(ulong)uVar5,__s);
      }
    }
    __s = pcVar4 + 1;
  } while (pcVar4 != text_end);
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > window->DC.LogLinePosY + 1);
    if (ref_pos)
        window->DC.LogLinePosY = ref_pos->y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}